

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

void ZopfliSublenToCache(unsigned_short *sublen,size_t pos,size_t length,
                        ZopfliLongestMatchCache *lmc)

{
  uchar *puVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (2 < length) {
    puVar1 = lmc->sublen;
    uVar4 = 0;
    uVar5 = 0;
    for (lVar3 = 0; lVar3 + 3U <= length; lVar3 = lVar3 + 1) {
      if ((length - 3 == lVar3) || (sublen[lVar3 + 3] != sublen[lVar3 + 4])) {
        lVar2 = uVar4 * 3;
        puVar1[lVar2 + pos * 0x18] = (uchar)lVar3;
        puVar1[lVar2 + pos * 0x18 + 1] = (uchar)sublen[lVar3 + 3];
        puVar1[lVar2 + pos * 0x18 + 2] = *(uchar *)((long)sublen + lVar3 * 2 + 7);
        uVar4 = uVar4 + 1;
        if (7 < uVar4) {
          return;
        }
        uVar5 = lVar3 + 3U & 0xffffffff;
      }
    }
    if (uVar4 < 8) {
      puVar1[pos * 0x18 + 0x15] = (char)uVar5 + 0xfd;
    }
  }
  return;
}

Assistant:

void ZopfliSublenToCache(const unsigned short* sublen,
                         size_t pos, size_t length,
                         ZopfliLongestMatchCache* lmc) {
  size_t i;
  size_t j = 0;
  unsigned bestlength = 0;
  unsigned char* cache;

#if ZOPFLI_CACHE_LENGTH == 0
  return;
#endif

  cache = &lmc->sublen[ZOPFLI_CACHE_LENGTH * pos * 3];
  if (length < 3) return;
  for (i = 3; i <= length; i++) {
    if (i == length || sublen[i] != sublen[i + 1]) {
      cache[j * 3] = i - 3;
      cache[j * 3 + 1] = sublen[i] % 256;
      cache[j * 3 + 2] = (sublen[i] >> 8) % 256;
      bestlength = i;
      j++;
      if (j >= ZOPFLI_CACHE_LENGTH) break;
    }
  }
  if (j < ZOPFLI_CACHE_LENGTH) {
    assert(bestlength == length);
    cache[(ZOPFLI_CACHE_LENGTH - 1) * 3] = bestlength - 3;
  } else {
    assert(bestlength <= length);
  }
  assert(bestlength == ZopfliMaxCachedSublen(lmc, pos, length));
}